

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

SingleOperationStatistics * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::
calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>>
          (SingleOperationStatistics *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
          *samples,offset_in_SampleType_to_deUint64 target)

{
  ulong uVar1;
  long lVar2;
  pointer puVar3;
  pointer puVar4;
  uint uVar5;
  SingleOperationStatistics *extraout_RAX;
  ulong *puVar6;
  ulong uVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  allocator_type local_71;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_70,(*(long *)(this + 8) - *(long *)this >> 3) * 0x6db6db6db6db6db7,&local_71);
  puVar4 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (int)(*(long *)(this + 8) - *(long *)this >> 3) * -0x49249249;
  if (0 < (int)uVar5) {
    puVar6 = (ulong *)((long)&(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::UnrelatedUploadRenderReadDuration>_>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + *(long *)this);
    uVar7 = 0;
    do {
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = *puVar6;
      uVar7 = uVar7 + 1;
      puVar6 = puVar6 + 7;
    } while ((uVar5 & 0x7fffffff) != uVar7);
  }
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar7 = (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    lVar2 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar3,puVar4);
  }
  __return_storage_ptr__->minTime =
       (float)*local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
  __return_storage_ptr__->maxTime =
       (float)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
  fStack_3c = (float)(((long)local_70.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_70.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  local_58 = ZEXT416((uint)fStack_3c);
  local_48 = fStack_3c * 0.5;
  fStack_44 = fStack_3c * 0.1;
  fStack_40 = fStack_3c * 0.0;
  fStack_3c = fStack_3c * 0.0;
  local_38 = floorf(local_48);
  fVar8 = floorf(fStack_44);
  iVar9 = (int)local_38;
  iVar10 = (int)fVar8;
  uVar7 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10];
  uVar1 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[iVar10 + 1];
  __return_storage_ptr__->medianTime =
       (float)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[iVar9 + 1] * (local_48 - (float)iVar9) +
       (float)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[iVar9] * (1.0 - (local_48 - (float)iVar9));
  __return_storage_ptr__->min2DecileTime =
       (float)uVar1 * (fStack_44 - (float)iVar10) +
       (float)uVar7 * (1.0 - (fStack_44 - (float)iVar10));
  local_58._0_4_ = (float)local_58._0_4_ * 0.9;
  fVar8 = floorf((float)local_58._0_4_);
  __return_storage_ptr__->max9DecileTime =
       (float)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar8 + 1] *
       ((float)local_58._0_4_ - (float)(int)fVar8) +
       (float)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(int)fVar8] *
       (1.0 - ((float)local_58._0_4_ - (float)(int)fVar8));
  operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return extraout_RAX;
}

Assistant:

SingleOperationStatistics calculateSingleOperationStatistics (const std::vector<T>& samples, deUint64 T::SampleType::*target)
{
	SingleOperationStatistics	stats;
	std::vector<deUint64>		values(samples.size());

	for (int ndx = 0; ndx < (int)samples.size(); ++ndx)
		values[ndx] = samples[ndx].duration.*target;

	std::sort(values.begin(), values.end());

	stats.minTime			= (float)values.front();
	stats.maxTime			= (float)values.back();
	stats.medianTime		= linearSample(values, 0.5f);
	stats.min2DecileTime	= linearSample(values, 0.1f);
	stats.max9DecileTime	= linearSample(values, 0.9f);

	return stats;
}